

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_wedge_utils_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::WedgeUtilsSSEOptTest_RandomValues_Test::
~WedgeUtilsSSEOptTest_RandomValues_Test(WedgeUtilsSSEOptTest_RandomValues_Test *this)

{
  anon_unknown.dwarf_16d3c6e::WedgeUtilsSSEOptTest_RandomValues_Test::
  ~WedgeUtilsSSEOptTest_RandomValues_Test((WedgeUtilsSSEOptTest_RandomValues_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(WedgeUtilsSSEOptTest, RandomValues) {
  DECLARE_ALIGNED(32, int16_t, r1[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int16_t, d[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, uint8_t, m[MAX_SB_SQUARE]);

  for (int iter = 0; iter < kIterations && !HasFatalFailure(); ++iter) {
    for (int i = 0; i < MAX_SB_SQUARE; ++i) {
      r1[i] = rng_(2 * kInt13Max + 1) - kInt13Max;
      d[i] = rng_(2 * kInt13Max + 1) - kInt13Max;
      m[i] = rng_(MAX_MASK_VALUE + 1);
    }

    const int N = 64 * (rng_(MAX_SB_SQUARE / 64) + 1);

    const uint64_t ref_res = params_.ref_func(r1, d, m, N);
    uint64_t tst_res;
    API_REGISTER_STATE_CHECK(tst_res = params_.tst_func(r1, d, m, N));

    ASSERT_EQ(ref_res, tst_res);
  }
}